

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

bool __thiscall Glucose::Solver::addClause_(Solver *this,vec<Glucose::Lit> *ps)

{
  byte bVar1;
  Lit *pLVar2;
  lbool *plVar3;
  bool bVar4;
  CRef CVar5;
  Ref RVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  bool bVar15;
  vec<Glucose::Lit> oc;
  CRef cr;
  vec<Glucose::Lit> local_48;
  CRef local_34;
  
  if (this->ok == true) {
    sort<Glucose::Lit,Glucose::LessThan_default<Glucose::Lit>>(ps->data,ps->sz);
    local_48.data = (Lit *)0x0;
    local_48.sz = 0;
    local_48.cap = 0;
    bVar4 = true;
    if ((this->certifiedUNSAT == true) && (0 < ps->sz)) {
      lVar13 = 0;
      lVar10 = 0;
      bVar4 = false;
      do {
        vec<Glucose::Lit>::push(&local_48,(Lit *)((long)&ps->data->x + lVar13));
        iVar12 = *(int *)((long)&ps->data->x + lVar13);
        bVar1 = (this->assigns).data[iVar12 >> 1].value;
        bVar7 = (byte)iVar12 & 1;
        if ((bVar1 ^ bVar7) == 1) {
          bVar4 = true;
        }
        if (bVar1 == bVar7) {
          bVar4 = true;
        }
        if (iVar12 == -1) {
          bVar4 = true;
        }
        lVar10 = lVar10 + 1;
        lVar13 = lVar13 + 4;
      } while (lVar10 < ps->sz);
      bVar4 = !bVar4;
    }
    iVar12 = ps->sz;
    if (iVar12 < 1) {
      iVar11 = 0;
    }
    else {
      pLVar2 = ps->data;
      plVar3 = (this->assigns).data;
      lVar10 = 0;
      uVar14 = 0xfffffffe;
      iVar11 = 0;
      do {
        uVar9 = pLVar2[lVar10].x;
        bVar1 = plVar3[(int)uVar9 >> 1].value;
        bVar7 = (byte)uVar9 & 1;
        bVar15 = true;
        if ((bVar1 == bVar7) || ((uVar9 ^ uVar14) == 1)) goto LAB_0010ba9b;
        if (((bVar1 ^ bVar7) != 1) && (uVar9 != uVar14)) {
          lVar13 = (long)iVar11;
          iVar11 = iVar11 + 1;
          pLVar2[lVar13].x = uVar9;
          uVar14 = uVar9;
        }
        lVar10 = lVar10 + 1;
        iVar12 = ps->sz;
      } while (lVar10 < iVar12);
      iVar11 = (int)lVar10 - iVar11;
    }
    if (0 < iVar11) {
      ps->sz = iVar12 - iVar11;
    }
    if ((!bVar4) && (this->certifiedUNSAT == true)) {
      if (this->vbyte == false) {
        if (0 < ps->sz) {
          lVar10 = 0;
          do {
            uVar14 = ps->data[lVar10].x;
            uVar8 = (int)uVar14 >> 1;
            uVar9 = ~uVar8;
            if ((uVar14 & 1) == 0) {
              uVar9 = uVar8 + 1;
            }
            fprintf((FILE *)this->certifiedOutput,"%i ",(ulong)uVar9);
            lVar10 = lVar10 + 1;
          } while (lVar10 < ps->sz);
        }
        fwrite("0\n",2,1,(FILE *)this->certifiedOutput);
        fwrite("d ",2,1,(FILE *)this->certifiedOutput);
        if (0 < local_48.sz) {
          lVar10 = 0;
          do {
            uVar9 = local_48.data[lVar10].x >> 1;
            uVar14 = ~uVar9;
            if ((local_48.data[lVar10].x & 1U) == 0) {
              uVar14 = uVar9 + 1;
            }
            fprintf((FILE *)this->certifiedOutput,"%i ",(ulong)uVar14);
            lVar10 = lVar10 + 1;
          } while (lVar10 < local_48.sz);
        }
        fwrite("0\n",2,1,(FILE *)this->certifiedOutput);
      }
      else {
        write_char(this,'a');
        if (0 < ps->sz) {
          lVar10 = 0;
          do {
            write_lit(this,ps->data[lVar10].x + 2);
            lVar10 = lVar10 + 1;
          } while (lVar10 < ps->sz);
        }
        write_char(this,'\0');
        write_char(this,'d');
        if (0 < local_48.sz) {
          lVar10 = 0;
          do {
            write_lit(this,local_48.data[lVar10].x + 2);
            lVar10 = lVar10 + 1;
          } while (lVar10 < local_48.sz);
        }
        write_char(this,'\0');
      }
    }
    iVar12 = ps->sz;
    if (iVar12 == 1) {
      iVar12 = ps->data->x;
      (this->assigns).data[iVar12 >> 1].value = (byte)iVar12 & 1;
      (this->vardata).data[iVar12 >> 1] =
           (VarData)((ulong)(uint)(this->trail_lim).sz << 0x20 | 0xffffffff);
      iVar11 = (this->trail).sz;
      (this->trail).sz = iVar11 + 1;
      (this->trail).data[iVar11].x = iVar12;
      CVar5 = propagate(this);
      bVar15 = CVar5 == 0xffffffff;
      this->ok = bVar15;
    }
    else if (iVar12 == 0) {
      this->ok = false;
      bVar15 = false;
    }
    else {
      uVar14 = (uint)(byte)(this->ca).super_RegionAllocator<unsigned_int>.field_0x14;
      RVar6 = RegionAllocator<unsigned_int>::alloc
                        (&(this->ca).super_RegionAllocator<unsigned_int>,iVar12 + uVar14 + 3);
      Clause::Clause<Glucose::vec<Glucose::Lit>>
                ((Clause *)((this->ca).super_RegionAllocator<unsigned_int>.memory + RVar6),ps,uVar14
                 ,false);
      local_34 = RVar6;
      vec<unsigned_int>::push(&this->clauses,&local_34);
      attachClause(this,local_34);
      bVar15 = true;
    }
LAB_0010ba9b:
    if (local_48.data != (Lit *)0x0) {
      local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
      free(local_48.data);
    }
  }
  else {
    bVar15 = false;
  }
  return bVar15;
}

Assistant:

bool Solver::addClause_(vec <Lit> &ps) {

    assert(decisionLevel() == 0);
    if(!ok) return false;

    // Check if clause is satisfied and remove false/duplicate literals:
    sort(ps);

    vec <Lit> oc;
    oc.clear();

    Lit p;
    int i, j, flag = 0;
    if(certifiedUNSAT) {
        for(i = j = 0, p = lit_Undef; i < ps.size(); i++) {
            oc.push(ps[i]);
            if(value(ps[i]) == l_True || ps[i] == ~p || value(ps[i]) == l_False)
                flag = 1;
        }
    }

    for(i = j = 0, p = lit_Undef; i < ps.size(); i++)
        if(value(ps[i]) == l_True || ps[i] == ~p)
            return true;
        else if(value(ps[i]) != l_False && ps[i] != p)
            ps[j++] = p = ps[i];
    ps.shrink(i - j);

    if(flag && (certifiedUNSAT)) {
        if(vbyte) {
            write_char('a');
            for(i = j = 0, p = lit_Undef; i < ps.size(); i++)
                write_lit(2 * (var(ps[i]) + 1) + sign(ps[i]));
            write_lit(0);

            write_char('d');
            for(i = j = 0, p = lit_Undef; i < oc.size(); i++)
                write_lit(2 * (var(oc[i]) + 1) + sign(oc[i]));
            write_lit(0);
        }
        else {
            for(i = j = 0, p = lit_Undef; i < ps.size(); i++)
                fprintf(certifiedOutput, "%i ", (var(ps[i]) + 1) * (-2 * sign(ps[i]) + 1));
            fprintf(certifiedOutput, "0\n");

            fprintf(certifiedOutput, "d ");
            for(i = j = 0, p = lit_Undef; i < oc.size(); i++)
                fprintf(certifiedOutput, "%i ", (var(oc[i]) + 1) * (-2 * sign(oc[i]) + 1));
            fprintf(certifiedOutput, "0\n");
        }
    }


    if(ps.size() == 0)
        return ok = false;
    else if(ps.size() == 1) {
        uncheckedEnqueue(ps[0]);
        return ok = (propagate() == CRef_Undef);
    } else {
        CRef cr = ca.alloc(ps, false);
        clauses.push(cr);
        attachClause(cr);
    }

    return true;
}